

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O3

void __thiscall efsw::FileWatcherInotify::~FileWatcherInotify(FileWatcherInotify *this)

{
  _Rb_tree_node_base *p_Var1;
  
  (this->super_FileWatcherImpl)._vptr_FileWatcherImpl =
       (_func_int **)&PTR__FileWatcherInotify_00127b88;
  (this->super_FileWatcherImpl).mInitOK = false;
  if (this->mThread != (Thread *)0x0) {
    (*this->mThread->_vptr_Thread[1])();
    this->mThread = (Thread *)0x0;
  }
  for (p_Var1 = (this->mWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->mWatches)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1[1]._M_parent != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_parent + 8))();
      p_Var1[1]._M_parent = (_Base_ptr)0x0;
    }
  }
  std::
  _Rb_tree<long,_std::pair<const_long,_efsw::WatcherInotify_*>,_std::_Select1st<std::pair<const_long,_efsw::WatcherInotify_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
  ::clear(&(this->mWatches)._M_t);
  if (this->mFD != -1) {
    close(this->mFD);
    this->mFD = -1;
  }
  Mutex::~Mutex(&this->mWatchesLock);
  std::
  _Rb_tree<long,_std::pair<const_long,_efsw::WatcherInotify_*>,_std::_Select1st<std::pair<const_long,_efsw::WatcherInotify_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
  ::~_Rb_tree(&(this->mRealWatches)._M_t);
  std::
  _Rb_tree<long,_std::pair<const_long,_efsw::WatcherInotify_*>,_std::_Select1st<std::pair<const_long,_efsw::WatcherInotify_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
  ::~_Rb_tree(&(this->mWatches)._M_t);
  FileWatcherImpl::~FileWatcherImpl(&this->super_FileWatcherImpl);
  return;
}

Assistant:

FileWatcherInotify::~FileWatcherInotify()
{
	mInitOK = false;

	efSAFE_DELETE( mThread );
	
	WatchMap::iterator iter = mWatches.begin();
	WatchMap::iterator end = mWatches.end();

	for(; iter != end; ++iter)
	{
		efSAFE_DELETE( iter->second );
	}

	mWatches.clear();

	if ( mFD != -1 )
	{
		close(mFD);
		mFD = -1;
	}
}